

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PFileReceiver.cpp
# Opt level: O1

void __thiscall
FileReceiverServerConnection::OnClose(FileReceiverServerConnection *this,SDKJsonResult *reason)

{
  ostringstream *this_00;
  pointer pcVar1;
  size_t sVar2;
  OutputWorker *this_01;
  char *local_240;
  long local_238;
  char local_230 [16];
  TonkStatusEx local_220;
  undefined1 local_1a0 [392];
  
  tonk::SDKConnection::GetStatusEx(&local_220,&this->super_SDKConnection);
  pcVar1 = (reason->ErrorJson)._M_dataplus._M_p;
  local_240 = local_230;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_240,pcVar1,pcVar1 + (reason->ErrorJson)._M_string_length);
  if ((int)Logger.ChannelMinLevel < 3) {
    this_00 = (ostringstream *)(local_1a0 + 0x10);
    local_1a0._0_8_ = Logger.ChannelName;
    local_1a0._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Rendezvous server connection closed: ",0x25);
    sVar2 = strlen(local_220.Remote.NetworkString);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,local_220.Remote.NetworkString,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", Reason: ",10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,local_240,local_238);
    this_01 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(this_01,(LogStringBuffer *)local_1a0);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
  }
  if (local_240 != local_230) {
    operator_delete(local_240);
  }
  return;
}

Assistant:

void FileReceiverServerConnection::OnClose(
    const tonk::SDKJsonResult& reason
)
{
    Logger.Info("Rendezvous server connection closed: ",
        GetStatusEx().Remote.NetworkString, ", Reason: ", reason.ToString());
}